

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CloseMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_vtab *psVar1;
  _func_int_sqlite3_vtab_cursor_ptr **local_28;
  Fts5Cursor **pp;
  Fts5Cursor *pCsr;
  Fts5FullTable *pTab;
  sqlite3_vtab_cursor *pCursor_local;
  
  if (pCursor != (sqlite3_vtab_cursor *)0x0) {
    psVar1 = pCursor->pVtab;
    fts5FreeCursorComponents((Fts5Cursor *)pCursor);
    for (local_28 = &(psVar1[2].pModule)->xNext; (sqlite3_vtab_cursor *)*local_28 != pCursor;
        local_28 = (_func_int_sqlite3_vtab_cursor_ptr **)(*local_28 + 8)) {
    }
    *local_28 = (_func_int_sqlite3_vtab_cursor_ptr *)pCursor[1].pVtab;
    sqlite3_free(pCursor);
  }
  return 0;
}

Assistant:

static int fts5CloseMethod(sqlite3_vtab_cursor *pCursor){
  if( pCursor ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCursor->pVtab);
    Fts5Cursor *pCsr = (Fts5Cursor*)pCursor;
    Fts5Cursor **pp;

    fts5FreeCursorComponents(pCsr);
    /* Remove the cursor from the Fts5Global.pCsr list */
    for(pp=&pTab->pGlobal->pCsr; (*pp)!=pCsr; pp=&(*pp)->pNext);
    *pp = pCsr->pNext;

    sqlite3_free(pCsr);
  }
  return SQLITE_OK;
}